

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O3

void Abc_CutFactor_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vLeaves)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  
  uVar1 = *(uint *)&pObj->field_0x14;
  while( true ) {
    if ((uVar1 & 0x10) != 0) {
      return;
    }
    if ((((uVar1 & 0xf) == 2) || ((uVar1 & 0xf) == 5)) ||
       ((1 < (pObj->vFanouts).nSize && (iVar2 = Abc_NodeIsMuxControlType(pObj), iVar2 == 0))))
    break;
    Abc_CutFactor_rec((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vLeaves);
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]];
    uVar1 = *(uint *)&pObj->field_0x14;
  }
  uVar1 = vLeaves->nSize;
  if (uVar1 == vLeaves->nCap) {
    if ((int)uVar1 < 0x10) {
      if (vLeaves->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vLeaves->pArray,0x80);
      }
      vLeaves->pArray = ppvVar3;
      vLeaves->nCap = 0x10;
    }
    else {
      if (vLeaves->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vLeaves->pArray,(ulong)uVar1 << 4);
      }
      vLeaves->pArray = ppvVar3;
      vLeaves->nCap = uVar1 * 2;
    }
  }
  else {
    ppvVar3 = vLeaves->pArray;
  }
  iVar2 = vLeaves->nSize;
  vLeaves->nSize = iVar2 + 1;
  ppvVar3[iVar2] = pObj;
  pObj->field_0x14 = pObj->field_0x14 | 0x10;
  return;
}

Assistant:

void Abc_CutFactor_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vLeaves )
{
    if ( pObj->fMarkA )
        return;
    if ( Abc_ObjIsCi(pObj) || (Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsMuxControlType(pObj)) )
    {
        Vec_PtrPush( vLeaves, pObj );
        pObj->fMarkA = 1;
        return;
    }
    Abc_CutFactor_rec( Abc_ObjFanin0(pObj), vLeaves );
    Abc_CutFactor_rec( Abc_ObjFanin1(pObj), vLeaves );
}